

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O0

void anon_unknown.dwarf_61130::invertM44f(M44f *m,float e)

{
  bool bVar1;
  M44f ident2;
  M44f ident1;
  M44f inv2;
  M44f inv1;
  Matrix44<float> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  Matrix44<float> *in_stack_ffffffffffffff00;
  Matrix44<float> *in_stack_ffffffffffffff08;
  Matrix44<float> *in_stack_ffffffffffffff98;
  Matrix44<float> *in_stack_ffffffffffffffa8;
  
  Imath_3_2::Matrix44<float>::inverse(in_stack_ffffffffffffff98);
  Imath_3_2::Matrix44<float>::gjInverse(in_stack_ffffffffffffffa8);
  Imath_3_2::Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  Imath_3_2::Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  bVar1 = Imath_3_2::Matrix44<float>::equalWithAbsError
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  if (!bVar1) {
    __assert_fail("ident1.equalWithAbsError (identity44f, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                  ,0x22,"void (anonymous namespace)::invertM44f(const M44f &, float)");
  }
  bVar1 = Imath_3_2::Matrix44<float>::equalWithAbsError
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  if (!bVar1) {
    __assert_fail("ident2.equalWithAbsError (identity44f, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                  ,0x23,"void (anonymous namespace)::invertM44f(const M44f &, float)");
  }
  return;
}

Assistant:

void
invertM44f (const M44f& m, float e)
{
    M44f inv1   = m.inverse ();
    M44f inv2   = m.gjInverse ();
    M44f ident1 = m * inv1;
    M44f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity44f, e));
    assert (ident2.equalWithAbsError (identity44f, e));
}